

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face.c
# Opt level: O0

bool_t prf_face_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  int8_t iVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  int16_t iVar4;
  int32_t iVar5;
  int iVar6;
  uint32_t uVar7;
  void *pvVar8;
  int iVar9;
  bfile_t *in_RDX;
  long *in_RSI;
  uint16_t *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict1 *data;
  int pos;
  bfile_t *in_stack_ffffffffffffffc8;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  int iVar10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar11;
  
  uVar3 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
  *in_RDI = uVar3;
  uVar3 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
  in_RDI[1] = uVar3;
  if (in_RDI[1] < 0x2c) {
    prf_error(3,"face node too short (only %d bytes)",(ulong)in_RDI[1]);
    bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
    bVar11 = 0;
  }
  else {
    if ((4 < in_RDI[1]) && (*(long *)(in_RDI + 4) == 0)) {
      if (*(short *)(*in_RSI + 8) == 0) {
        pvVar8 = malloc((long)(int)(in_RDI[1] - 4));
        *(void **)(in_RDI + 4) = pvVar8;
      }
      else {
        pvVar8 = pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
        *(void **)(in_RDI + 4) = pvVar8;
      }
      if (*(long *)(in_RDI + 4) == 0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
        return 0;
      }
    }
    iVar10 = 4;
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
            (uint)((ulong)in_RDI >> 0x20));
    iVar10 = iVar10 + 8;
    iVar5 = bf_get_int32_be(bfile_00);
    *(int32_t *)&bfile_00->file = iVar5;
    iVar10 = iVar10 + 4;
    iVar4 = bf_get_int16_be(bfile_00);
    *(int16_t *)((long)&bfile_00->file + 4) = iVar4;
    iVar10 = iVar10 + 2;
    iVar1 = bf_get_int8(in_stack_ffffffffffffffc8);
    *(int8_t *)((long)&bfile_00->file + 6) = iVar1;
    iVar10 = iVar10 + 1;
    iVar1 = bf_get_int8(in_stack_ffffffffffffffc8);
    *(int8_t *)((long)&bfile_00->file + 7) = iVar1;
    iVar10 = iVar10 + 1;
    uVar3 = bf_get_uint16_be(bfile_00);
    *(uint16_t *)&bfile_00->size = uVar3;
    iVar10 = iVar10 + 2;
    uVar3 = bf_get_uint16_be(bfile_00);
    *(uint16_t *)((long)&bfile_00->size + 2) = uVar3;
    iVar10 = iVar10 + 2;
    iVar1 = bf_get_int8(in_stack_ffffffffffffffc8);
    *(int8_t *)((long)&bfile_00->size + 4) = iVar1;
    iVar10 = iVar10 + 1;
    iVar1 = bf_get_int8(in_stack_ffffffffffffffc8);
    *(int8_t *)((long)&bfile_00->size + 5) = iVar1;
    iVar10 = iVar10 + 1;
    iVar4 = bf_get_int16_be(bfile_00);
    *(int16_t *)((long)&bfile_00->size + 6) = iVar4;
    iVar10 = iVar10 + 2;
    iVar4 = bf_get_int16_be(bfile_00);
    *(int16_t *)&bfile_00->pos = iVar4;
    iVar10 = iVar10 + 2;
    iVar4 = bf_get_int16_be(bfile_00);
    *(int16_t *)((long)&bfile_00->pos + 2) = iVar4;
    iVar10 = iVar10 + 2;
    iVar4 = bf_get_int16_be(bfile_00);
    *(int16_t *)((long)&bfile_00->pos + 4) = iVar4;
    iVar10 = iVar10 + 2;
    iVar4 = bf_get_int16_be(bfile_00);
    *(int16_t *)((long)&bfile_00->pos + 6) = iVar4;
    iVar10 = iVar10 + 2;
    iVar5 = bf_get_int32_be(bfile_00);
    *(int32_t *)&bfile_00->ipos = iVar5;
    iVar10 = iVar10 + 4;
    uVar3 = bf_get_uint16_be(bfile_00);
    *(uint16_t *)((long)&bfile_00->ipos + 4) = uVar3;
    iVar10 = iVar10 + 2;
    uVar2 = bf_get_uint8((bfile_t *)CONCAT44(iVar10,in_stack_ffffffffffffffd8));
    *(uint8_t *)((long)&bfile_00->ipos + 6) = uVar2;
    iVar10 = iVar10 + 1;
    uVar2 = bf_get_uint8((bfile_t *)CONCAT44(iVar10,in_stack_ffffffffffffffd8));
    *(uint8_t *)((long)&bfile_00->ipos + 7) = uVar2;
    iVar6 = iVar10 + 1;
    if (iVar10 + 5 <= (int)(uint)in_RDI[1]) {
      uVar7 = bf_get_uint32_be(bfile_00);
      *(uint32_t *)&bfile_00->filename = uVar7;
      iVar10 = iVar6 + 4;
      iVar9 = iVar6 + 5;
      iVar6 = iVar10;
      if (iVar9 <= (int)(uint)in_RDI[1]) {
        uVar2 = bf_get_uint8((bfile_t *)CONCAT44(iVar10,in_stack_ffffffffffffffd8));
        *(uint8_t *)((long)&bfile_00->filename + 4) = uVar2;
        iVar9 = iVar10 + 1;
        iVar6 = iVar9;
        if (iVar10 + 2 <= (int)(uint)in_RDI[1]) {
          uVar2 = bf_get_uint8((bfile_t *)CONCAT44(iVar9,in_stack_ffffffffffffffd8));
          *(uint8_t *)((long)&bfile_00->filename + 5) = uVar2;
          iVar10 = iVar9 + 1;
          iVar6 = iVar10;
          if (iVar9 + 3 <= (int)(uint)in_RDI[1]) {
            uVar3 = bf_get_uint16_be(bfile_00);
            *(uint16_t *)((long)&bfile_00->filename + 6) = uVar3;
            iVar9 = iVar10 + 2;
            iVar6 = iVar9;
            if (iVar10 + 6 <= (int)(uint)in_RDI[1]) {
              uVar7 = bf_get_uint32_be(bfile_00);
              *(uint32_t *)&bfile_00->buffer = uVar7;
              iVar10 = iVar9 + 4;
              iVar6 = iVar10;
              if (iVar9 + 8 <= (int)(uint)in_RDI[1]) {
                uVar7 = bf_get_uint32_be(bfile_00);
                *(uint32_t *)((long)&bfile_00->buffer + 4) = uVar7;
                iVar9 = iVar10 + 4;
                iVar6 = iVar9;
                if (iVar10 + 8 <= (int)(uint)in_RDI[1]) {
                  uVar7 = bf_get_uint32_be(bfile_00);
                  bfile_00->buffer_size = uVar7;
                  iVar10 = iVar9 + 4;
                  iVar6 = iVar10;
                  if (iVar9 + 6 <= (int)(uint)in_RDI[1]) {
                    iVar4 = bf_get_int16_be(bfile_00);
                    *(int16_t *)&bfile_00->field_0x3c = iVar4;
                    iVar9 = iVar10 + 2;
                    iVar6 = iVar9;
                    if (iVar10 + 4 <= (int)(uint)in_RDI[1]) {
                      iVar4 = bf_get_int16_be(bfile_00);
                      *(int16_t *)&bfile_00->field_0x3e = iVar4;
                      iVar10 = iVar9 + 2;
                      iVar6 = iVar10;
                      if (iVar9 + 6 <= (int)(uint)in_RDI[1]) {
                        uVar7 = bf_get_uint32_be(bfile_00);
                        *(uint32_t *)&bfile_00->progress_cb = uVar7;
                        iVar9 = iVar10 + 4;
                        iVar6 = iVar9;
                        if (iVar10 + 8 <= (int)(uint)in_RDI[1]) {
                          uVar7 = bf_get_uint32_be(bfile_00);
                          *(uint32_t *)((long)&bfile_00->progress_cb + 4) = uVar7;
                          iVar10 = iVar9 + 4;
                          iVar6 = iVar10;
                          if (iVar9 + 6 <= (int)(uint)in_RDI[1]) {
                            iVar4 = bf_get_int16_be(bfile_00);
                            *(int16_t *)&bfile_00->progress_data = iVar4;
                            iVar6 = iVar10 + 2;
                            if (iVar10 + 4 <= (int)(uint)in_RDI[1]) {
                              iVar4 = bf_get_int16_be(bfile_00);
                              *(int16_t *)((long)&bfile_00->progress_data + 2) = iVar4;
                              iVar6 = iVar6 + 2;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (iVar6 < (int)(uint)in_RDI[1]) {
      bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(uint)((ulong)in_RDI >> 0x20));
    }
    bVar11 = 1;
  }
  return bVar11;
}

Assistant:

static
bool_t
prf_face_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );
 
    node->opcode = bf_get_uint16_be( bfile );
    assert( node->opcode == prf_face_info.opcode );

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < 44 ) {
        prf_error( 3, "face node too short (only %d bytes)", node->length );
        bf_rewind( bfile, 4 );
        return FALSE;
    }

    if ( node->length > 4 && node->data == NULL ) { /* not pre-allocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        bf_read( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        data->ir_color_code = bf_get_int32_be( bfile ); pos += 4;
        data->relative_priority = bf_get_int16_be( bfile ); pos += 2;
        data->draw_type = bf_get_int8( bfile ); pos += 1;
        data->texture_white = bf_get_int8( bfile ); pos += 1;
        data->color_name_index = bf_get_uint16_be( bfile ); pos += 2;
        data->alternate_color_name_index = bf_get_uint16_be( bfile ); pos += 2;
        data->reserved1 = bf_get_int8( bfile ); pos += 1;
        data->billboard_flags = bf_get_int8( bfile ); pos += 1;
        data->detail_texture_pattern_index = bf_get_int16_be( bfile ); pos += 2;
        data->texture_pattern_index = bf_get_int16_be( bfile ); pos += 2;
        data->material_index = bf_get_int16_be( bfile ); pos += 2;
        data->surface_material_code = bf_get_int16_be( bfile ); pos += 2;
        data->feature_id = bf_get_int16_be( bfile ); pos += 2;
        data->ir_material_code = bf_get_int32_be( bfile ); pos += 4;
        data->transparency = bf_get_uint16_be( bfile ); pos += 2;
        data->lod_generation_control = bf_get_uint8( bfile ); pos += 1;
        data->line_style_index = bf_get_uint8( bfile ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 1) ) break;
        data->light_mode = bf_get_uint8( bfile ); pos += 1;
        if ( node->length < (pos + 1) ) break;
        data->reserved2 = bf_get_uint8( bfile ); pos += 1;
        if ( node->length < (pos + 2) ) break;
        data->reserved3 = bf_get_uint16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->reserved4 = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->packed_color_primary = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->packed_color_alternate = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->texture_mapping_index = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved5 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        data->primary_color_index = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->alternate_color_index = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        data->reserved6 = bf_get_int16_be( bfile ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        data->reserved7 = bf_get_int16_be( bfile ); pos += 2;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}